

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O0

void __thiscall Dinic::addEdge(Dinic *this,int a,int b,Flow cap)

{
  reference pvVar1;
  size_type sVar2;
  int local_5c;
  Edge local_58;
  int local_3c;
  Edge local_38;
  Flow local_20;
  Flow cap_local;
  int b_local;
  int a_local;
  Dinic *this_local;
  
  local_20 = cap;
  cap_local._0_4_ = b;
  cap_local._4_4_ = a;
  _b_local = this;
  Edge::Edge(&local_38,a,b,cap);
  std::vector<Edge,_std::allocator<Edge>_>::push_back(&this->e,&local_38);
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->g,(long)cap_local._4_4_);
  sVar2 = std::vector<Edge,_std::allocator<Edge>_>::size(&this->e);
  local_3c = (int)sVar2 + -1;
  std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_3c);
  Edge::Edge(&local_58,(int)cap_local,cap_local._4_4_,0);
  std::vector<Edge,_std::allocator<Edge>_>::push_back(&this->e,&local_58);
  pvVar1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->g,(long)(int)cap_local);
  sVar2 = std::vector<Edge,_std::allocator<Edge>_>::size(&this->e);
  local_5c = (int)sVar2 + -1;
  std::vector<int,_std::allocator<int>_>::push_back(pvVar1,&local_5c);
  return;
}

Assistant:

void addEdge(int a, int b, Flow cap) {
        e.push_back(Edge(a, b, cap));
        g[a].push_back(e.size() - 1);
        e.push_back(Edge(b, a, 0));
        g[b].push_back(e.size() - 1);
    }